

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUBMX055.cpp
# Opt level: O0

bool __thiscall RTIMUBMX055::IMURead(RTIMUBMX055 *this)

{
  bool bVar1;
  uint64_t uVar2;
  RTFLOAT RVar3;
  RTFLOAT RVar4;
  RTFLOAT local_3c;
  RTFLOAT temp;
  float mz;
  float my;
  float mx;
  uchar magData [8];
  uchar accelData [6];
  uchar gyroData [6];
  uchar status;
  RTIMUBMX055 *this_local;
  
  unique0x100006cf = this;
  bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_gyroSlaveAddr,
                            '\x0e','\x01',accelData + 4,"Failed to read BMX055 gyro fifo status");
  if (bVar1) {
    if ((accelData[4] & 0x80) == 0) {
      if (accelData[4] == '\0') {
        this_local._7_1_ = false;
      }
      else {
        bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                  this->m_gyroSlaveAddr,'?','\x06',magData + 6,
                                  "Failed to read BMX055 gyro data");
        if (bVar1) {
          bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                    this->m_accelSlaveAddr,'\x02','\x06',magData,
                                    "Failed to read BMX055 accel data");
          if (bVar1) {
            bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                      this->m_magSlaveAddr,'B','\b',(uchar *)((long)&my + 3),
                                      "Failed to read BMX055 mag data");
            if (bVar1) {
              RTMath::convertToVector
                        (magData + 6,&(this->super_RTIMU).m_imuData.gyro,this->m_gyroScale,false);
              magData[0] = magData[0] & 0xf0;
              magData[2] = magData[2] & 0xf0;
              magData[4] = magData[4] & 0xf0;
              RTMath::convertToVector
                        (magData,&(this->super_RTIMU).m_imuData.accel,this->m_accelScale,false);
              processMagData(this,(uchar *)((long)&my + 3),&mz,&temp,&local_3c);
              RTVector3::setX(&(this->super_RTIMU).m_imuData.compass,mz);
              RTVector3::setY(&(this->super_RTIMU).m_imuData.compass,temp);
              RTVector3::setZ(&(this->super_RTIMU).m_imuData.compass,local_3c);
              RVar3 = RTVector3::y(&(this->super_RTIMU).m_imuData.gyro);
              RTVector3::setY(&(this->super_RTIMU).m_imuData.gyro,-RVar3);
              RVar3 = RTVector3::z(&(this->super_RTIMU).m_imuData.gyro);
              RTVector3::setZ(&(this->super_RTIMU).m_imuData.gyro,-RVar3);
              RVar3 = RTVector3::x(&(this->super_RTIMU).m_imuData.accel);
              RTVector3::setX(&(this->super_RTIMU).m_imuData.accel,-RVar3);
              RVar3 = RTVector3::x(&(this->super_RTIMU).m_imuData.compass);
              RVar4 = RTVector3::y(&(this->super_RTIMU).m_imuData.compass);
              RTVector3::setX(&(this->super_RTIMU).m_imuData.compass,-RVar4);
              RTVector3::setY(&(this->super_RTIMU).m_imuData.compass,-RVar3);
              RVar3 = RTVector3::z(&(this->super_RTIMU).m_imuData.compass);
              RTVector3::setZ(&(this->super_RTIMU).m_imuData.compass,-RVar3);
              RTIMU::handleGyroBias(&this->super_RTIMU);
              RTIMU::calibrateAverageCompass(&this->super_RTIMU);
              RTIMU::calibrateAccel(&this->super_RTIMU);
              if ((this->m_firstTime & 1U) == 0) {
                (this->super_RTIMU).m_imuData.timestamp =
                     (this->super_RTIMU).m_sampleInterval + (this->super_RTIMU).m_imuData.timestamp;
              }
              else {
                uVar2 = RTMath::currentUSecsSinceEpoch();
                (this->super_RTIMU).m_imuData.timestamp = uVar2;
              }
              this->m_firstTime = false;
              RTIMU::updateFusion(&this->super_RTIMU);
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
    else {
      fprintf(_stderr,"BMX055 fifo overflow\n");
      bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                 this->m_gyroSlaveAddr,'>','@',"Failed to set BMX055 FIFO config");
      if (bVar1) {
        uVar2 = RTMath::currentUSecsSinceEpoch();
        (this->super_RTIMU).m_imuData.timestamp = uVar2;
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RTIMUBMX055::IMURead()
{
    unsigned char status;
    unsigned char gyroData[6];
    unsigned char accelData[6];
    unsigned char magData[8];

    if (!m_settings->HALRead(m_gyroSlaveAddr, BMX055_GYRO_FIFO_STATUS, 1, &status, "Failed to read BMX055 gyro fifo status"))
        return false;

    if (status & 0x80) {
        // fifo overflowed
        HAL_ERROR("BMX055 fifo overflow\n");

        // this should clear it
        if (!m_settings->HALWrite(m_gyroSlaveAddr, BMX055_GYRO_FIFO_CONFIG_1, 0x40, "Failed to set BMX055 FIFO config"))
            return false;

        m_imuData.timestamp = RTMath::currentUSecsSinceEpoch();  // try to fix timestamp
        return false;
    }

    if (status == 0)
        return false;

    if (!m_settings->HALRead(m_gyroSlaveAddr, BMX055_GYRO_FIFO_DATA, 6, gyroData, "Failed to read BMX055 gyro data"))
            return false;

    if (!m_settings->HALRead(m_accelSlaveAddr, BMX055_ACCEL_X_LSB, 6, accelData, "Failed to read BMX055 accel data"))
        return false;

    if (!m_settings->HALRead(m_magSlaveAddr, BMX055_MAG_X_LSB, 8, magData, "Failed to read BMX055 mag data"))
        return false;

    RTMath::convertToVector(gyroData, m_imuData.gyro, m_gyroScale, false);

    //  need to prepare accel data

    accelData[0] &= 0xf0;
    accelData[2] &= 0xf0;
    accelData[4] &= 0xf0;

    RTMath::convertToVector(accelData, m_imuData.accel, m_accelScale, false);

    float mx, my, mz;

    processMagData(magData, mx, my, mz);
    m_imuData.compass.setX(mx);
    m_imuData.compass.setY(my);
    m_imuData.compass.setZ(mz);

    //  sort out gyro axes

    m_imuData.gyro.setY(-m_imuData.gyro.y());
    m_imuData.gyro.setZ(-m_imuData.gyro.z());

    //  sort out accel axes

    m_imuData.accel.setX(-m_imuData.accel.x());

    //  sort out mag axes

#ifdef BMX055_REMAP
    m_imuData.compass.setY(-m_imuData.compass.y());
    m_imuData.compass.setZ(-m_imuData.compass.z());
#else
    RTFLOAT temp =  m_imuData.compass.x();
    m_imuData.compass.setX(-m_imuData.compass.y());
    m_imuData.compass.setY(-temp);
    m_imuData.compass.setZ(-m_imuData.compass.z());
#endif
    //  now do standard processing

    handleGyroBias();
    calibrateAverageCompass();
    calibrateAccel();

    if (m_firstTime)
        m_imuData.timestamp = RTMath::currentUSecsSinceEpoch();
    else
        m_imuData.timestamp += m_sampleInterval;

    m_firstTime = false;

    //  now update the filter

    updateFusion();

    return true;
}